

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<signed_char,int>(void)

{
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int iVar2;
  int local_40;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_39;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  int u;
  
  u = 0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_39,&u);
  su.m_int = u;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>(&st2,&su)
  ;
  local_39.m_int = '\0';
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             &u);
  SafeCastHelper<signed_char,_int,_4>::
  CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(su.m_int,(char *)&local_39);
  local_39.m_int = st2.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            (&local_39,st2);
  operator*(u,local_39);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             su);
  iVar2 = 1;
  local_40 = iVar2;
  u = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             &local_40);
  su.m_int = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  local_40 = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
             &local_40);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            (&local_39,st2);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             su);
  local_40 = iVar2;
  u = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
             &local_40);
  local_40 = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             &local_40);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            (&local_39,st2);
  operator/(u,local_39);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             su);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            (&local_39,st2);
  operator+(u,local_39);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             su);
  local_40 = 0;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             &local_40);
  u = 0;
  local_40 = 0;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
             &local_40);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            (&local_39,st2);
  operator-(u,local_39);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  local_40 = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             &local_40);
  su.m_int = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  su.m_int = iVar2;
  u = iVar2;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             1);
  SVar1 = SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                    ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &local_39,su);
  operator<<(SVar1.m_int,su);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             su);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SVar1 = SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                    ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &local_39,su);
  operator>>(SVar1.m_int,su);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             u);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_39,
             su);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            (&local_39,st2);
  local_40 = BinaryAndHelper<int,_signed_char,_1>::And(su.m_int,local_39.m_int & (byte)u);
  SafeInt::operator_cast_to_signed_char((SafeInt *)&local_40);
  local_39.m_int = (byte)su.m_int & (byte)u & local_39.m_int & st2.m_int;
  local_40 = BinaryOrHelper<int,_signed_char,_1>::Or(su.m_int,(byte)u);
  SafeInt::operator_cast_to_signed_char((SafeInt *)&local_40);
  local_39.m_int = (byte)su.m_int | (byte)u | local_39.m_int | st2.m_int;
  local_40 = BinaryXorHelper<int,_signed_char,_1>::Xor(su.m_int,local_39.m_int ^ (byte)u);
  SafeInt::operator_cast_to_signed_char((SafeInt *)&local_40);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}